

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O2

long duckdb::DateDiffTernaryOperator::
     Operation<duckdb::string_t,duckdb::dtime_t,duckdb::dtime_t,long>
               (string_t part,dtime_t startdate,dtime_t enddate,ValidityMask *mask,idx_t idx)

{
  DatePartSpecifier DVar1;
  long lVar2;
  NotImplementedException *this;
  dtime_t enddate_00;
  long lVar3;
  dtime_t startdate_00;
  allocator local_71;
  string local_70;
  string local_50;
  string_t part_local;
  
  part_local.value.pointer.ptr = (char *)part.value._8_8_;
  part_local.value._0_8_ = part.value._0_8_;
  enddate_00.micros = (int64_t)&part_local;
  startdate_00.micros = (int64_t)&local_70;
  string_t::GetString_abi_cxx11_((string *)startdate_00.micros,(string_t *)enddate_00.micros);
  DVar1 = GetDatePartSpecifier((string *)startdate_00.micros);
  switch(DVar1) {
  case BEGIN_BIGINT:
    DateDiff::YearOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00)
    ;
  case MONTH:
    DateDiff::MonthOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case DAY:
  case DOW:
  case ISODOW:
  case DOY:
  case JULIAN_DAY:
    DateDiff::DayOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00);
  case DECADE:
    DateDiff::DecadeOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case CENTURY:
    DateDiff::CenturyOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case MILLENNIUM:
    DateDiff::MilleniumOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case MICROSECONDS:
    lVar2 = enddate.micros - startdate.micros;
    goto LAB_01c9dd57;
  case MILLISECONDS:
    lVar2 = enddate.micros / 1000;
    lVar3 = -1000;
    break;
  case SECOND:
  case BEGIN_DOUBLE:
    lVar2 = enddate.micros / 1000000;
    lVar3 = -1000000;
    break;
  case MINUTE:
    lVar2 = enddate.micros / 60000000;
    lVar3 = -60000000;
    break;
  case HOUR:
    lVar2 = enddate.micros / 3600000000;
    lVar3 = -3600000000;
    break;
  case WEEK:
  case YEARWEEK:
    DateDiff::WeekOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00)
    ;
  case ISOYEAR:
    DateDiff::ISOYearOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case QUARTER:
    DateDiff::QuarterOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"Specifier type not implemented for DATEDIFF",&local_71);
    NotImplementedException::NotImplementedException(this,&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar2 = startdate.micros / lVar3 + lVar2;
LAB_01c9dd57:
  ::std::__cxx11::string::~string((string *)&local_70);
  return lVar2;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}